

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O2

spv_result_t
spvExtInstTableNameLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,char *name,spv_ext_inst_desc *pEntry)

{
  uint uVar1;
  uint uVar2;
  spv_ext_inst_group_t *psVar3;
  spv_ext_inst_desc_t *psVar4;
  long lVar5;
  int iVar6;
  spv_result_t sVar7;
  long lVar8;
  ulong uVar9;
  
  if (table == (spv_ext_inst_table)0x0) {
    sVar7 = SPV_ERROR_INVALID_TABLE;
  }
  else if (pEntry == (spv_ext_inst_desc *)0x0) {
    sVar7 = SPV_ERROR_INVALID_POINTER;
  }
  else {
    uVar1 = table->count;
    for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
      psVar3 = table->groups;
      if (psVar3[uVar9].type == type) {
        uVar2 = psVar3[uVar9].count;
        lVar5 = -0xb8;
        while (lVar8 = lVar5, (ulong)uVar2 * 0xb8 - (lVar8 + 0xb8) != 0) {
          psVar4 = psVar3[uVar9].entries;
          iVar6 = strcmp(name,*(char **)((long)psVar4[1].operandTypes + lVar8 + -0x18));
          lVar5 = lVar8 + 0xb8;
          if (iVar6 == 0) {
            *pEntry = (spv_ext_inst_desc)((long)psVar4[1].operandTypes + lVar8 + -0x18);
            return SPV_SUCCESS;
          }
        }
      }
    }
    sVar7 = SPV_ERROR_INVALID_LOOKUP;
  }
  return sVar7;
}

Assistant:

spv_result_t spvExtInstTableNameLookup(const spv_ext_inst_table table,
                                       const spv_ext_inst_type_t type,
                                       const char* name,
                                       spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (!strcmp(name, entry.name)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}